

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver.hpp
# Opt level: O1

bool __thiscall
mp::NLSolver::ReadSolution<mp::SOLHandler_Easy>(NLSolver *this,SOLHandler_Easy *solh)

{
  size_type sVar1;
  pointer pcVar2;
  bool bVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  pair<NLW2_SOLReadResultCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  status;
  string local_4f8;
  NLW2_SOLReadResultCode local_4d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  undefined1 local_4b0 [16];
  SOLHandler_Easy local_4a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_380;
  _Alloc_hider local_370;
  size_type local_368;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_360;
  undefined8 local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  Long local_110 [2];
  int local_84;
  
  sVar1 = (this->filestub_)._M_string_length;
  if (sVar1 == 0) {
    bVar3 = false;
    std::__cxx11::string::_M_replace
              ((ulong)&this->err_msg_,0,(char *)(this->err_msg_)._M_string_length,0x113809);
  }
  else {
    local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
    pcVar2 = (this->filestub_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>((string *)&local_4f8,pcVar2,pcVar2 + sVar1);
    std::__cxx11::string::append((char *)&local_4f8);
    local_4b0._8_8_ = this->p_ut_;
    local_4b0._0_8_ = solh;
    memcpy(&local_4a0,solh,0x110);
    local_4a0.sol_ = (NLSolution *)0x0;
    local_380._M_local_buf[0] = '\0';
    local_368 = 0;
    local_360._M_local_buf[0] = '\0';
    local_350._0_4_ = 0;
    local_350._4_4_ = NLW2_SOLRead_Result_Not_Set;
    local_348 = (char *)0x0;
    local_340 = "ASCII";
    local_338 = "binary";
    local_110[0] = -2;
    local_110[1] = -2;
    local_84 = -2;
    local_4a0.pd_ = (PreprocessData *)&local_380;
    local_370._M_p = (pointer)&local_360;
    local_4d8 = SOLReader2<mp::SOLHandler_Easy>::ReadSOLFile
                          ((SOLReader2<mp::SOLHandler_Easy> *)local_4b0,&local_4f8);
    local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_4d0,local_370._M_p,local_370._M_p + local_368);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370._M_p != &local_360) {
      operator_delete(local_370._M_p,
                      CONCAT71(local_360._M_allocated_capacity._1_7_,local_360._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a0.pd_ != &local_380) {
      operator_delete(local_4a0.pd_,
                      CONCAT71(local_380._M_allocated_capacity._1_7_,local_380._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
      operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
    }
    bVar3 = local_4d8 == NLW2_SOLRead_OK;
    if (!bVar3) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4b0,
                     "SOLReader error: ",&local_4d0);
      std::__cxx11::string::operator=((string *)&this->err_msg_,(string *)local_4b0);
      if ((SOLHandler_Easy *)local_4b0._0_8_ != &local_4a0) {
        operator_delete((void *)local_4b0._0_8_,
                        local_4a0.header_.super_NLProblemInfo.super_NLProblemInfo_C._0_8_ + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
      operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
    }
  }
  return bVar3;
}

Assistant:

bool NLSolver::ReadSolution(SOLHandler& solh) {
  if (GetFileStub().empty())
    return (err_msg_="SOLReader: provide filename.", false);
  auto status = mp::ReadSOLFile(
        GetFileStub() + ".sol", solh, Utils());
  if (NLW2_SOLRead_OK != status.first)
    return (err_msg_="SOLReader error: "+status.second, false);
  return true;
}